

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value_on_rehash
          (robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           *this,size_t ibucket,distance_type dist_from_ideal_bucket,truncated_hash_type hash,
          value_type *value)

{
  bool bVar1;
  distance_type dVar2;
  undefined4 in_ECX;
  int iVar3;
  short in_DX;
  bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *in_RSI;
  value_type *in_RDI;
  bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *in_R8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffec;
  
  do {
    iVar3 = (int)in_DX;
    dVar2 = bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::
            dist_from_ideal_bucket
                      ((bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *)
                       ((in_RDI->second).num_weight.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)in_RSI * 0x20));
    if (dVar2 < iVar3) {
      bVar1 = bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::empty
                        ((bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>
                          *)((in_RDI->second).num_weight.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + (long)in_RSI * 0x20));
      if (bVar1) {
        bucket_entry<std::pair<unsigned_long,ImputedData<long,double>>,false>::
        set_value_of_empty_bucket<std::pair<unsigned_long,ImputedData<long,double>>>
                  (in_R8,(distance_type)((ulong)in_RDI >> 0x30),(truncated_hash_type)in_RDI,
                   (pair<unsigned_long,_ImputedData<long,_double>_> *)
                   CONCAT44(iVar3,in_stack_ffffffffffffffd0));
        return;
      }
      bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::
      swap_with_value_in_bucket
                (in_RSI,(distance_type *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffec,in_ECX)),
                 (truncated_hash_type *)in_R8,in_RDI);
    }
    in_DX = in_DX + 1;
    in_RSI = (bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *)
             next_bucket<tsl::rh::power_of_two_growth_policy<2UL>,_nullptr>
                       ((robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                         *)in_RDI,(size_t)in_RSI);
  } while( true );
}

Assistant:

void insert_value_on_rehash(std::size_t ibucket,
                              distance_type dist_from_ideal_bucket,
                              truncated_hash_type hash, value_type&& value) {
    while (true) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (m_buckets[ibucket].empty()) {
          m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket,
                                                       hash, std::move(value));
          return;
        } else {
          m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                       hash, value);
        }
      }

      dist_from_ideal_bucket++;
      ibucket = next_bucket(ibucket);
    }
  }